

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegrationPoints.h
# Opt level: O2

IntegrationPointList<1> * anurbs::IntegrationPoints::gauss_legendre(size_t degree)

{
  invalid_argument *this;
  
  if (degree != 0) {
    if (degree <= (ulong)((_DAT_00395670 - s_gauss_legendre) / 0x18)) {
      return (IntegrationPointList<1> *)(degree * 0x18 + s_gauss_legendre + -0x18);
    }
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid degree");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static IntegrationPointList<1>& gauss_legendre(const size_t degree)
    {
        if (degree < 1 || degree > s_gauss_legendre.size()) {
            throw std::invalid_argument("Invalid degree");
        }

        return s_gauss_legendre[degree - 1];
    }